

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginDragDropTarget(void)

{
  ImGuiWindow *r_abs;
  ImGuiID id;
  ImRect *display_rect;
  ImGuiWindow *hovered_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *local_38;
  ImGuiID local_2c;
  ImGuiContext *pIVar1;
  bool local_1;
  
  if ((GImGui->DragDropActive & 1U) == 0) {
    local_1 = false;
  }
  else {
    r_abs = GImGui->CurrentWindow;
    if (((GImGui->LastItemData).StatusFlags & 1U) == 0) {
      local_1 = false;
    }
    else if (((GImGui->HoveredWindowUnderMovingWindow == (ImGuiWindow *)0x0) ||
             (r_abs->RootWindow != GImGui->HoveredWindowUnderMovingWindow->RootWindow)) ||
            ((r_abs->SkipItems & 1U) != 0)) {
      local_1 = false;
    }
    else {
      if (((GImGui->LastItemData).StatusFlags & 2U) == 0) {
        local_38 = &(GImGui->LastItemData).Rect;
      }
      else {
        local_38 = &(GImGui->LastItemData).DisplayRect;
      }
      local_2c = (GImGui->LastItemData).ID;
      pIVar1 = GImGui;
      if (local_2c == 0) {
        local_2c = ImGuiWindow::GetIDFromRectangle((ImGuiWindow *)GImGui,(ImRect *)r_abs);
      }
      if ((pIVar1->DragDropPayload).SourceId == local_2c) {
        local_1 = false;
      }
      else {
        (pIVar1->DragDropTargetRect).Min = local_38->Min;
        (pIVar1->DragDropTargetRect).Max = local_38->Max;
        pIVar1->DragDropTargetId = local_2c;
        pIVar1->DragDropWithinTarget = true;
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool ImGui::BeginDragDropTarget()
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (!(g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HoveredRect))
        return false;
    ImGuiWindow* hovered_window = g.HoveredWindowUnderMovingWindow;
    if (hovered_window == NULL || window->RootWindow != hovered_window->RootWindow || window->SkipItems)
        return false;

    const ImRect& display_rect = (g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HasDisplayRect) ? g.LastItemData.DisplayRect : g.LastItemData.Rect;
    ImGuiID id = g.LastItemData.ID;
    if (id == 0)
        id = window->GetIDFromRectangle(display_rect);
    if (g.DragDropPayload.SourceId == id)
        return false;

    IM_ASSERT(g.DragDropWithinTarget == false);
    g.DragDropTargetRect = display_rect;
    g.DragDropTargetId = id;
    g.DragDropWithinTarget = true;
    return true;
}